

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2NullVsEmptyString(void)

{
  bool bVar1;
  StringPiece empty;
  StringPiece null;
  RE2 re;
  StringPiece local_288;
  StringPiece local_278;
  LogMessageFatal local_268;
  RE2 local_e8;
  
  RE2::RE2(&local_e8,".*");
  if (local_e8.error_code_ != NoError) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x589);
    std::operator<<((ostream *)&local_268.super_LogMessage.str_,"Check failed: re.ok()");
    LogMessageFatal::~LogMessageFatal(&local_268);
  }
  local_278.ptr_ = (char *)0x0;
  local_278.length_ = 0;
  bVar1 = RE2::FullMatch<>(&local_278,&local_e8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x58c);
    std::operator<<((ostream *)&local_268.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(null, re)");
    LogMessageFatal::~LogMessageFatal(&local_268);
  }
  local_288.ptr_ = "";
  local_288.length_ = 0;
  bVar1 = RE2::FullMatch<>(&local_288,&local_e8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x58f);
    std::operator<<((ostream *)&local_268.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(empty, re)");
    LogMessageFatal::~LogMessageFatal(&local_268);
  }
  RE2::~RE2(&local_e8);
  return;
}

Assistant:

TEST(RE2, NullVsEmptyString) {
  RE2 re(".*");
  EXPECT_TRUE(re.ok());

  StringPiece null;
  EXPECT_TRUE(RE2::FullMatch(null, re));

  StringPiece empty("");
  EXPECT_TRUE(RE2::FullMatch(empty, re));
}